

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  char cVar7;
  undefined8 uVar8;
  seqStore_t *psVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  int *piVar18;
  int *piVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  uint uVar22;
  int *piVar23;
  long lVar24;
  int iVar25;
  BYTE *pBVar26;
  int *piVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  int *piVar32;
  ZSTD_matchState_t *pZVar33;
  size_t offbaseFound;
  int *local_d0;
  ZSTD_matchState_t *local_c8;
  int *local_c0;
  uint local_b8;
  uint local_b4;
  int *local_b0;
  int *local_a8;
  uint local_9c;
  ulong local_98;
  uint local_8c;
  int *local_88;
  uint local_7c;
  seqStore_t *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  int *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  pBVar2 = (ms->window).base;
  local_b8 = (ms->cParams).minMatch;
  if (5 < local_b8) {
    local_b8 = 6;
  }
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_8c = (ms->cParams).searchLog;
  local_b4 = 6;
  if (local_8c < 6) {
    local_b4 = local_8c;
  }
  uVar11 = (ms->window).dictLimit;
  local_98 = (ulong)uVar11;
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  local_68 = pBVar2 + local_98;
  pZVar33 = ms->dictMatchState;
  local_60 = (pZVar33->window).base;
  local_40 = local_60 + (pZVar33->window).dictLimit;
  local_70 = (int *)(pZVar33->window).nextSrc;
  uVar10 = ((int)src - ((int)local_40 + (int)local_68)) + (int)local_70;
  piVar32 = (int *)((long)src + (ulong)(uVar10 == 0));
  uVar12 = *rep;
  local_c8 = ms;
  if (uVar10 < uVar12) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar17 = rep[1];
  local_9c = uVar17;
  local_48 = rep;
  if (uVar10 < uVar17) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_88 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar10 = ms->nextToUpdate;
  uVar13 = (ulong)uVar10;
  uVar22 = ((int)local_88 - (int)(pBVar2 + uVar13)) + 1;
  uVar28 = 8;
  if (uVar22 < 8) {
    uVar28 = uVar22;
  }
  if (local_88 < pBVar2 + uVar13) {
    uVar28 = 0;
  }
  bVar16 = (byte)local_b4;
  local_b0 = (int *)src;
  local_78 = seqStore;
  if (uVar10 < uVar28 + uVar10) {
    local_c0 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_007a003c:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar26 = ms->tagTable;
    uVar15 = ms->hashSalt;
    cVar7 = (char)ms->rowHashLog;
    local_58 = (BYTE *)0xcf1bbcdcbf9b0000;
    do {
      if (local_b8 == 5) {
        uVar29 = *(long *)(pBVar2 + uVar13) * -0x30e4432345000000;
LAB_0079f2f3:
        uVar22 = (uint)((uVar29 ^ uVar15) >> (0x38U - cVar7 & 0x3f));
      }
      else {
        if (local_b8 == 6) {
          uVar29 = *(long *)(pBVar2 + uVar13) * -0x30e4432340650000;
          goto LAB_0079f2f3;
        }
        uVar22 = (*(int *)(pBVar2 + uVar13) * -0x61c8864f ^ (uint)uVar15) >> (0x18U - cVar7 & 0x1f);
      }
      uVar31 = (uVar22 >> 8) << (bVar16 & 0x1f);
      if (((ulong)(pUVar3 + uVar31) & 0x3f) != 0) {
LAB_0079ff44:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar26 + uVar31) & ~(-1L << (bVar16 & 0x3f))) != 0) {
LAB_0079ff25:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar13 & 7] = uVar22;
      uVar13 = uVar13 + 1;
    } while (uVar28 + uVar10 != uVar13);
  }
  local_c0 = (int *)(srcSize + (long)src);
  if (piVar32 < local_88) {
    local_7c = ((int)local_60 - (int)local_70) + uVar11;
    local_58 = local_60 + -(ulong)local_7c;
    local_50 = local_c0 + -8;
    local_38 = ~(-1L << (bVar16 & 0x3f));
    do {
      piVar27 = local_c0;
      local_a8 = (int *)((long)piVar32 + 1);
      iVar25 = (int)pBVar2;
      uVar11 = (((int)piVar32 - iVar25) - uVar12) + 1;
      piVar23 = (int *)(pBVar2 + uVar11);
      if (uVar11 < (uint)local_98) {
        piVar23 = (int *)(local_60 + (uVar11 - local_7c));
      }
      local_9c = uVar17;
      if ((uVar11 - (uint)local_98 < 0xfffffffd) && (*piVar23 == *local_a8)) {
        piVar18 = local_c0;
        if (uVar11 < (uint)local_98) {
          piVar18 = local_70;
        }
        sVar14 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar32 + 5),(BYTE *)(piVar23 + 1),(BYTE *)local_c0,
                            (BYTE *)piVar18,local_68);
        uVar13 = sVar14 + 4;
      }
      else {
        uVar13 = 0;
      }
      local_d0 = (int *)0x3b9ac9ff;
      if (local_b8 == 6) {
        if (local_b4 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
        else if (local_b4 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
      }
      else if (local_b8 == 5) {
        if (local_b4 == 6) {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
        else if (local_b4 == 5) {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
        else {
          uVar15 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                             (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
        }
      }
      else if (local_b4 == 6) {
        uVar15 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                           (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
      }
      else if (local_b4 == 5) {
        uVar15 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                           (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
      }
      else {
        uVar15 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                           (local_c8,(BYTE *)piVar32,(BYTE *)piVar27,(size_t *)&local_d0);
      }
      uVar29 = uVar13;
      if (uVar13 < uVar15) {
        uVar29 = uVar15;
      }
      if (uVar29 < 4) {
        uVar13 = (long)piVar32 - (long)local_b0;
        piVar32 = (int *)((long)piVar32 + (uVar13 >> 8) + 1);
        local_c8->lazySkipping = (uint)(0x7ff < uVar13);
        uVar17 = local_9c;
      }
      else {
        piVar23 = piVar32;
        piVar27 = local_d0;
        if (uVar15 <= uVar13) {
          piVar23 = local_a8;
          piVar27 = (int *)&DAT_00000001;
        }
        local_a8 = piVar23;
        if (piVar32 < local_88) {
          do {
            piVar23 = (int *)((long)piVar32 + 1);
            uVar11 = ((int)piVar23 - iVar25) - uVar12;
            piVar18 = (int *)(pBVar2 + uVar11);
            if (uVar11 < (uint)local_98) {
              piVar18 = (int *)(local_60 + (uVar11 - local_7c));
            }
            if ((uVar11 - (uint)local_98 < 0xfffffffd) && (*piVar18 == *piVar23)) {
              piVar19 = local_c0;
              if (uVar11 < (uint)local_98) {
                piVar19 = local_70;
              }
              sVar14 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar32 + 5),(BYTE *)(piVar18 + 1),(BYTE *)local_c0
                                  ,(BYTE *)piVar19,local_68);
              uVar11 = (uint)piVar27;
              if (uVar11 == 0) goto LAB_0079ff06;
              if (sVar14 < 0xfffffffffffffffc) {
                uVar10 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar29 * 3 + -0x1e) < (int)(sVar14 + 4) * 3) {
                  piVar27 = (int *)&DAT_00000001;
                  uVar29 = sVar14 + 4;
                  local_a8 = piVar23;
                }
              }
            }
            local_d0 = (int *)0x3b9ac9ff;
            if (local_b8 == 6) {
              if (local_b4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else if (local_b4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
            }
            else if (local_b8 == 5) {
              if (local_b4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else if (local_b4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
            }
            else if (local_b4 == 6) {
              uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                 (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
            }
            else if (local_b4 == 5) {
              uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                 (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
            }
            else {
              uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                 (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
            }
            uVar11 = (uint)local_d0;
            if ((uVar11 == 0) || (uVar10 = (uint)piVar27, uVar10 == 0)) {
LAB_0079ff06:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            bVar6 = true;
            if (3 < uVar13) {
              iVar5 = 0x1f;
              if (uVar11 != 0) {
                for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              uVar11 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 4 + -0x1b) < (int)uVar13 * 4 - iVar5) {
                bVar6 = false;
                piVar27 = local_d0;
                uVar29 = uVar13;
                local_a8 = piVar23;
              }
            }
            if (bVar6) {
              if (local_88 <= piVar23) break;
              piVar23 = (int *)((long)piVar32 + 2);
              uVar11 = ((int)piVar23 - iVar25) - uVar12;
              piVar18 = (int *)(pBVar2 + uVar11);
              if (uVar11 < (uint)local_98) {
                piVar18 = (int *)(local_60 + (uVar11 - local_7c));
              }
              if ((uVar11 - (uint)local_98 < 0xfffffffd) && (*piVar18 == *piVar23)) {
                piVar19 = local_c0;
                if (uVar11 < (uint)local_98) {
                  piVar19 = local_70;
                }
                sVar14 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar32 + 6),(BYTE *)(piVar18 + 1),
                                    (BYTE *)local_c0,(BYTE *)piVar19,local_68);
                uVar11 = (uint)piVar27;
                if (uVar11 == 0) goto LAB_0079ff06;
                if (sVar14 < 0xfffffffffffffffc) {
                  uVar10 = 0x1f;
                  if (uVar11 != 0) {
                    for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                    }
                  }
                  if ((int)((uVar10 ^ 0x1f) + (int)uVar29 * 4 + -0x1e) < (int)(sVar14 + 4) * 4) {
                    piVar27 = (int *)&DAT_00000001;
                    uVar29 = sVar14 + 4;
                    local_a8 = piVar23;
                  }
                }
              }
              local_d0 = (int *)0x3b9ac9ff;
              if (local_b8 == 6) {
                if (local_b4 == 6) {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
                else if (local_b4 == 5) {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
                else {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
              }
              else if (local_b8 == 5) {
                if (local_b4 == 6) {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
                else if (local_b4 == 5) {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
                else {
                  uVar13 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                                     (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0)
                  ;
                }
              }
              else if (local_b4 == 6) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else if (local_b4 == 5) {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              else {
                uVar13 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                                   (local_c8,(BYTE *)piVar23,(BYTE *)local_c0,(size_t *)&local_d0);
              }
              uVar11 = (uint)local_d0;
              if ((uVar11 == 0) || (uVar10 = (uint)piVar27, uVar10 == 0)) goto LAB_0079ff06;
              bVar6 = true;
              if (3 < uVar13) {
                iVar5 = 0x1f;
                if (uVar11 != 0) {
                  for (; uVar11 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                uVar11 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                if ((int)((uVar11 ^ 0x1f) + (int)uVar29 * 4 + -0x18) < (int)uVar13 * 4 - iVar5) {
                  bVar6 = false;
                  piVar27 = local_d0;
                  uVar29 = uVar13;
                  local_a8 = piVar23;
                }
              }
              if (bVar6) break;
            }
            piVar32 = piVar23;
          } while (piVar32 < local_88);
        }
        piVar32 = local_b0;
        pZVar33 = local_c8;
        uVar11 = uVar12;
        uVar17 = local_9c;
        if ((int *)0x3 < piVar27) {
          pBVar20 = (BYTE *)((long)local_a8 + (-(long)pBVar2 - (long)piVar27) + -0xfffffffd);
          pBVar21 = pBVar2;
          pBVar26 = local_68;
          if ((uint)pBVar20 < (uint)local_98) {
            pBVar21 = local_58;
            pBVar26 = local_40;
          }
          if ((local_b0 < local_a8) &&
             (uVar13 = (ulong)pBVar20 & 0xffffffff, pBVar26 < pBVar21 + uVar13)) {
            pBVar21 = pBVar21 + uVar13;
            do {
              piVar23 = (int *)((long)local_a8 + -1);
              pBVar21 = pBVar21 + -1;
              if ((*(BYTE *)piVar23 != *pBVar21) ||
                 (uVar29 = uVar29 + 1, local_a8 = piVar23, piVar23 <= local_b0)) break;
            } while (pBVar26 < pBVar21);
          }
          uVar11 = (int)piVar27 - 3;
          uVar17 = uVar12;
        }
        if (local_78->maxNbSeq <=
            (ulong)((long)local_78->sequences - (long)local_78->sequencesStart >> 3)) {
LAB_0079ffc0:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_78->maxNbLit) {
LAB_0079ff63:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar13 = (long)local_a8 - (long)local_b0;
        pBVar26 = local_78->lit;
        if (local_78->litStart + local_78->maxNbLit < pBVar26 + uVar13) {
LAB_0079ffdf:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c0 < local_a8) {
LAB_0079ffa1:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < local_a8) {
          local_b0 = piVar27;
          ZSTD_safecopyLiterals(pBVar26,(BYTE *)piVar32,(BYTE *)local_a8,(BYTE *)local_50);
          piVar27 = local_b0;
        }
        else {
          uVar8 = *(undefined8 *)(local_b0 + 2);
          *(undefined8 *)pBVar26 = *(undefined8 *)local_b0;
          *(undefined8 *)(pBVar26 + 8) = uVar8;
          if (0x10 < uVar13) {
            pBVar26 = local_78->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar26 + 0x10 + (-0x10 - (long)(local_b0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(local_b0 + 6);
            *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)(local_b0 + 4);
            *(undefined8 *)(pBVar26 + 0x18) = uVar8;
            if (0x20 < (long)uVar13) {
              lVar24 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_b0 + lVar24 + 0x20);
                uVar8 = puVar1[1];
                pBVar21 = pBVar26 + lVar24 + 0x20;
                *(undefined8 *)pBVar21 = *puVar1;
                *(undefined8 *)(pBVar21 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_b0 + lVar24 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar21 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar21 + 0x18) = uVar8;
                lVar24 = lVar24 + 0x20;
              } while (pBVar21 + 0x20 < pBVar26 + uVar13);
            }
          }
        }
        psVar9 = local_78;
        local_78->lit = local_78->lit + uVar13;
        if (0xffff < uVar13) {
          if (local_78->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_78->longLengthType = ZSTD_llt_literalLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)local_78->sequences - (long)local_78->sequencesStart) >> 3);
        }
        psVar4 = local_78->sequences;
        psVar4->litLength = (U16)uVar13;
        psVar4->offBase = (U32)piVar27;
        if (uVar29 < 3) {
LAB_0079ff82:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar29 - 3) {
          if (local_78->longLengthType != ZSTD_llt_none) {
LAB_0079fffe:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_78->longLengthType = ZSTD_llt_matchLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_78->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar29 - 3);
        local_78->sequences = psVar4 + 1;
        if (pZVar33->lazySkipping != 0) {
          uVar12 = pZVar33->nextToUpdate;
          uVar13 = (ulong)uVar12;
          uVar10 = ((int)local_88 - (int)(pBVar2 + uVar13)) + 1;
          if (7 < uVar10) {
            uVar10 = 8;
          }
          if (local_88 < pBVar2 + uVar13) {
            uVar10 = 0;
          }
          if (uVar12 < uVar10 + uVar12) {
            if (0x20 < pZVar33->rowHashLog + 8) goto LAB_007a003c;
            pUVar3 = pZVar33->hashTable;
            pBVar26 = pZVar33->tagTable;
            uVar15 = pZVar33->hashSalt;
            cVar7 = (char)pZVar33->rowHashLog;
            do {
              if (local_b8 == 5) {
                uVar30 = *(long *)(pBVar2 + uVar13) * -0x30e4432345000000;
LAB_0079fcd6:
                uVar28 = (uint)((uVar30 ^ uVar15) >> (0x38U - cVar7 & 0x3f));
              }
              else {
                if (local_b8 == 6) {
                  uVar30 = *(long *)(pBVar2 + uVar13) * -0x30e4432340650000;
                  goto LAB_0079fcd6;
                }
                uVar28 = (*(int *)(pBVar2 + uVar13) * -0x61c8864f ^ (uint)uVar15) >>
                         (0x18U - cVar7 & 0x1f);
              }
              uVar22 = (uVar28 >> 8) << ((byte)local_b4 & 0x1f);
              if (((ulong)(pUVar3 + uVar22) & 0x3f) != 0) goto LAB_0079ff44;
              if ((local_38 & (ulong)(pBVar26 + uVar22)) != 0) goto LAB_0079ff25;
              local_c8->hashCache[(uint)uVar13 & 7] = uVar28;
              uVar13 = uVar13 + 1;
              pZVar33 = local_c8;
            } while (uVar10 + uVar12 != uVar13);
          }
          pZVar33->lazySkipping = 0;
        }
        piVar32 = (int *)((long)local_a8 + uVar29);
        local_b0 = piVar32;
        do {
          uVar12 = uVar11;
          if (local_88 < piVar32) break;
          uVar12 = ((int)piVar32 - iVar25) - uVar17;
          pBVar26 = pBVar2;
          if (uVar12 < (uint)local_98) {
            pBVar26 = local_58;
          }
          if ((uVar12 - (uint)local_98 < 0xfffffffd) && (*(int *)(pBVar26 + uVar12) == *piVar32)) {
            piVar27 = local_c0;
            if (uVar12 < (uint)local_98) {
              piVar27 = local_70;
            }
            sVar14 = ZSTD_count_2segments
                               ((BYTE *)(piVar32 + 1),(BYTE *)((long)(pBVar26 + uVar12) + 4),
                                (BYTE *)local_c0,(BYTE *)piVar27,local_68);
            if (psVar9->maxNbSeq <=
                (ulong)((long)psVar9->sequences - (long)psVar9->sequencesStart >> 3))
            goto LAB_0079ffc0;
            if (0x20000 < psVar9->maxNbLit) goto LAB_0079ff63;
            pBVar26 = psVar9->lit;
            if (psVar9->litStart + psVar9->maxNbLit < pBVar26) goto LAB_0079ffdf;
            if (local_c0 < local_b0) goto LAB_0079ffa1;
            if (local_50 < local_b0) {
              ZSTD_safecopyLiterals(pBVar26,(BYTE *)local_b0,(BYTE *)local_b0,(BYTE *)local_50);
            }
            else {
              uVar8 = *(undefined8 *)(local_b0 + 2);
              *(undefined8 *)pBVar26 = *(undefined8 *)local_b0;
              *(undefined8 *)(pBVar26 + 8) = uVar8;
            }
            psVar4 = psVar9->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar14 + 4 < 3) goto LAB_0079ff82;
            if (0xffff < sVar14 + 1) {
              if (psVar9->longLengthType != ZSTD_llt_none) goto LAB_0079fffe;
              psVar9->longLengthType = ZSTD_llt_matchLength;
              psVar9->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar9->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar14 + 1);
            psVar9->sequences = psVar4 + 1;
            piVar32 = (int *)((long)piVar32 + sVar14 + 4);
            bVar6 = true;
            uVar12 = uVar11;
            uVar11 = uVar17;
            local_b0 = piVar32;
          }
          else {
            bVar6 = false;
            uVar12 = uVar17;
          }
          uVar17 = uVar12;
          uVar12 = uVar11;
        } while (bVar6);
      }
    } while (piVar32 < local_88);
  }
  *local_48 = uVar12;
  local_48[1] = uVar17;
  return (long)local_c0 - (long)local_b0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
ZSTD_compressBlock_lazy_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth,
                        ZSTD_dictMode_e const dictMode)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = (searchMethod == search_rowHash) ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 prefixLowestIndex = ms->window.dictLimit;
    const BYTE* const prefixLowest = base + prefixLowestIndex;
    const U32 mls = BOUNDED(4, ms->cParams.minMatch, 6);
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);

    U32 offset_1 = rep[0], offset_2 = rep[1];
    U32 offsetSaved1 = 0, offsetSaved2 = 0;

    const int isDMS = dictMode == ZSTD_dictMatchState;
    const int isDDS = dictMode == ZSTD_dedicatedDictSearch;
    const int isDxS = isDMS || isDDS;
    const ZSTD_matchState_t* const dms = ms->dictMatchState;
    const U32 dictLowestIndex      = isDxS ? dms->window.dictLimit : 0;
    const BYTE* const dictBase     = isDxS ? dms->window.base : NULL;
    const BYTE* const dictLowest   = isDxS ? dictBase + dictLowestIndex : NULL;
    const BYTE* const dictEnd      = isDxS ? dms->window.nextSrc : NULL;
    const U32 dictIndexDelta       = isDxS ?
                                     prefixLowestIndex - (U32)(dictEnd - dictBase) :
                                     0;
    const U32 dictAndPrefixLength = (U32)((ip - prefixLowest) + (dictEnd - dictLowest));

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_generic (dictMode=%u) (searchFunc=%u)", (U32)dictMode, (U32)searchMethod);
    ip += (dictAndPrefixLength == 0);
    if (dictMode == ZSTD_noDict) {
        U32 const curr = (U32)(ip - base);
        U32 const windowLow = ZSTD_getLowestPrefixIndex(ms, curr, ms->cParams.windowLog);
        U32 const maxRep = curr - windowLow;
        if (offset_2 > maxRep) offsetSaved2 = offset_2, offset_2 = 0;
        if (offset_1 > maxRep) offsetSaved1 = offset_1, offset_1 = 0;
    }
    if (isDxS) {
        /* dictMatchState repCode checks don't currently handle repCode == 0
         * disabling. */
        assert(offset_1 <= dictAndPrefixLength);
        assert(offset_2 <= dictAndPrefixLength);
    }

    /* Reset the lazy skipping state */
    ms->lazySkipping = 0;

    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offBase = REPCODE1_TO_OFFBASE;
        const BYTE* start=ip+1;
        DEBUGLOG(7, "search baseline (depth 0)");

        /* check repCode */
        if (isDxS) {
            const U32 repIndex = (U32)(ip - base) + 1 - offset_1;
            const BYTE* repMatch = ((dictMode == ZSTD_dictMatchState || dictMode == ZSTD_dedicatedDictSearch)
                                && repIndex < prefixLowestIndex) ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
            if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
                const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                if (depth==0) goto _storeSequence;
            }
        }
        if ( dictMode == ZSTD_noDict
          && ((offset_1 > 0) & (MEM_read32(ip+1-offset_1) == MEM_read32(ip+1)))) {
            matchLength = ZSTD_count(ip+1+4, ip+1+4-offset_1, iend) + 4;
            if (depth==0) goto _storeSequence;
        }

        /* first search (depth 0) */
        {   size_t offbaseFound = 999999999;
            size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &offbaseFound, mls, rowLog, searchMethod, dictMode);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offBase = offbaseFound;
        }

        if (matchLength < 4) {
            size_t const step = ((size_t)(ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */;
            ip += step;
            /* Enter the lazy skipping mode once we are skipping more than 8 bytes at a time.
             * In this mode we stop inserting every position into our tables, and only insert
             * positions that we search, which is one in step positions.
             * The exact cutoff is flexible, I've just chosen a number that is reasonably high,
             * so we minimize the compression ratio loss in "normal" scenarios. This mode gets
             * triggered once we've gone 2KB without finding any matches.
             */
            ms->lazySkipping = step > kLazySkippingStep;
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            DEBUGLOG(7, "search depth 1");
            ip ++;
            if ( (dictMode == ZSTD_noDict)
              && (offBase) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                int const gain2 = (int)(mlRep * 3);
                int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offBase) + 1);
                if ((mlRep >= 4) && (gain2 > gain1))
                    matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
            }
            if (isDxS) {
                const U32 repIndex = (U32)(ip - base) - offset_1;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                               dictBase + (repIndex - dictIndexDelta) :
                               base + repIndex;
                if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                    && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                    size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                    int const gain2 = (int)(mlRep * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offBase) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                }
            }
            {   size_t ofbCandidate=999999999;
                size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, dictMode);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offBase = ofbCandidate, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                DEBUGLOG(7, "search depth 2");
                ip ++;
                if ( (dictMode == ZSTD_noDict)
                  && (offBase) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                    size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                    int const gain2 = (int)(mlRep * 4);
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                }
                if (isDxS) {
                    const U32 repIndex = (U32)(ip - base) - offset_1;
                    const BYTE* repMatch = repIndex < prefixLowestIndex ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
                    if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                        && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                        const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                        size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                        int const gain2 = (int)(mlRep * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 1);
                        if ((mlRep >= 4) && (gain2 > gain1))
                            matchLength = mlRep, offBase = REPCODE1_TO_OFFBASE, start = ip;
                    }
                }
                {   size_t ofbCandidate=999999999;
                    size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, dictMode);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offBase = ofbCandidate, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* NOTE:
         * Pay attention that `start[-value]` can lead to strange undefined behavior
         * notably if `value` is unsigned, resulting in a large positive `-value`.
         */
        /* catch up */
        if (OFFBASE_IS_OFFSET(offBase)) {
            if (dictMode == ZSTD_noDict) {
                while ( ((start > anchor) & (start - OFFBASE_TO_OFFSET(offBase) > prefixLowest))
                     && (start[-1] == (start-OFFBASE_TO_OFFSET(offBase))[-1]) )  /* only search for offset within prefix */
                    { start--; matchLength++; }
            }
            if (isDxS) {
                U32 const matchIndex = (U32)((size_t)(start-base) - OFFBASE_TO_OFFSET(offBase));
                const BYTE* match = (matchIndex < prefixLowestIndex) ? dictBase + matchIndex - dictIndexDelta : base + matchIndex;
                const BYTE* const mStart = (matchIndex < prefixLowestIndex) ? dictLowest : prefixLowest;
                while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            }
            offset_2 = offset_1; offset_1 = (U32)OFFBASE_TO_OFFSET(offBase);
        }
        /* store sequence */
_storeSequence:
        {   size_t const litLength = (size_t)(start - anchor);
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offBase, matchLength);
            anchor = ip = start + matchLength;
        }
        if (ms->lazySkipping) {
            /* We've found a match, disable lazy skipping mode, and refill the hash cache. */
            if (searchMethod == search_rowHash) {
                ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
            }
            ms->lazySkipping = 0;
        }

        /* check immediate repcode */
        if (isDxS) {
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex = current2 - offset_2;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                        dictBase - dictIndexDelta + repIndex :
                        base + repIndex;
                if ( ((U32)((prefixLowestIndex-1) - (U32)repIndex) >= 3 /* intentional overflow */)
                   && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex < prefixLowestIndex ? dictEnd : iend;
                    matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd2, prefixLowest) + 4;
                    offBase = offset_2; offset_2 = offset_1; offset_1 = (U32)offBase;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, matchLength);
                    ip += matchLength;
                    anchor = ip;
                    continue;
                }
                break;
            }
        }

        if (dictMode == ZSTD_noDict) {
            while ( ((ip <= ilimit) & (offset_2>0))
                 && (MEM_read32(ip) == MEM_read32(ip - offset_2)) ) {
                /* store sequence */
                matchLength = ZSTD_count(ip+4, ip+4-offset_2, iend) + 4;
                offBase = offset_2; offset_2 = offset_1; offset_1 = (U32)offBase; /* swap repcodes */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, matchLength);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
    }   }   }

    /* If offset_1 started invalid (offsetSaved1 != 0) and became valid (offset_1 != 0),
     * rotate saved offsets. See comment in ZSTD_compressBlock_fast_noDict for more context. */
    offsetSaved2 = ((offsetSaved1 != 0) && (offset_1 != 0)) ? offsetSaved1 : offsetSaved2;

    /* save reps for next block */
    rep[0] = offset_1 ? offset_1 : offsetSaved1;
    rep[1] = offset_2 ? offset_2 : offsetSaved2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}